

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_pushstring(lua_State *L,char *s)

{
  StkId pSVar1;
  TString *local_38;
  TString *x_;
  TValue *io;
  TString *ts;
  char *s_local;
  lua_State *L_local;
  
  if (s == (char *)0x0) {
    *(undefined1 *)((L->top).offset + 8) = 0;
    ts = (TString *)0x0;
  }
  else {
    local_38 = luaS_new(L,s);
    pSVar1 = (L->top).p;
    *(TString **)pSVar1 = local_38;
    (pSVar1->val).tt_ = local_38->tt | 0x40;
    if (local_38->shrlen < '\0') {
      local_38 = (TString *)local_38->contents;
    }
    else {
      local_38 = (TString *)&local_38->contents;
    }
    ts = local_38;
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  return (char *)ts;
}

Assistant:

LUA_API const char *lua_pushstring (lua_State *L, const char *s) {
  lua_lock(L);
  if (s == NULL)
    setnilvalue(s2v(L->top.p));
  else {
    TString *ts;
    ts = luaS_new(L, s);
    setsvalue2s(L, L->top.p, ts);
    s = getstr(ts);  /* internal copy's address */
  }
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return s;
}